

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCastToDecimal::Operation<duckdb::string_t,short>
          (TryCastToDecimal *this,string_t input,int16_t *result,CastParameters *parameters,
          uint8_t width,uint8_t scale)

{
  bool bVar1;
  char *string_ptr;
  undefined8 uStack_10;
  char *pcStack_8;
  
  pcStack_8 = input.value._0_8_;
  string_ptr = (char *)((long)&uStack_10 + 4);
  if (0xc < (uint)this) {
    string_ptr = pcStack_8;
  }
  uStack_10 = this;
  bVar1 = TryDecimalStringCast<short,(char)46>
                    (string_ptr,(ulong)this & 0xffffffff,input.value._8_8_,(CastParameters *)result,
                     (uint8_t)parameters,width);
  return bVar1;
}

Assistant:

bool TryCastToDecimal::Operation(string_t input, int16_t &result, CastParameters &parameters, uint8_t width,
                                 uint8_t scale) {
	return TryDecimalStringCast<int16_t>(input, result, parameters, width, scale);
}